

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O2

void __thiscall
google::protobuf::internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
          (InternalMetadata *this,UnknownFieldSet *other)

{
  _Vector_impl_data *this_00;
  
  if (((ulong)this->ptr_ & 1) == 0) {
    this_00 = (_Vector_impl_data *)
              mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this);
  }
  else {
    this_00 = (_Vector_impl_data *)(((ulong)this->ptr_ & 0xfffffffffffffffe) + 8);
  }
  std::_Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ::_Vector_impl_data::_M_swap_data(this_00,(_Vector_impl_data *)other);
  return;
}

Assistant:

void DoSwap(T* other) {
    mutable_unknown_fields<T>()->Swap(other);
  }